

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

void __thiscall wabt::ObjdumpNames::Set(ObjdumpNames *this,Index index,string_view name)

{
  mapped_type *this_00;
  allocator<char> local_49;
  string local_48 [36];
  Index local_24;
  ObjdumpNames *pOStack_20;
  Index index_local;
  ObjdumpNames *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (ObjdumpNames *)name._M_len;
  local_24 = index;
  pOStack_20 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_48,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,&local_49);
  this_00 = std::
            map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->names,&local_24);
  std::__cxx11::string::operator=((string *)this_00,local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  return;
}

Assistant:

void ObjdumpNames::Set(Index index, std::string_view name) {
  names[index] = std::string(name);
}